

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_Internal_ExtrudedVertex * __thiscall
ON_SimpleArray<ON_Internal_ExtrudedVertex>::AppendNew
          (ON_SimpleArray<ON_Internal_ExtrudedVertex> *this)

{
  uint uVar1;
  int iVar2;
  ON_Internal_ExtrudedVertex *pOVar3;
  ON_Internal_ExtrudedVertex *pOVar4;
  uint uVar5;
  
  uVar1 = this->m_count;
  if (uVar1 == this->m_capacity) {
    if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 * 0x38) < 0x10000001)) {
      uVar5 = 4;
      if (2 < (int)uVar1) {
        uVar5 = uVar1 * 2;
      }
    }
    else {
      uVar5 = 0x49249a;
      if ((int)uVar1 < 0x49249a) {
        uVar5 = uVar1;
      }
      uVar5 = uVar5 + uVar1;
    }
    if ((uint)this->m_capacity < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
  }
  pOVar3 = this->m_a;
  iVar2 = this->m_count;
  pOVar3[iVar2].m_original_vertex = (ON_SubDVertex *)0x0;
  (&pOVar3[iVar2].m_original_vertex)[1] = (ON_SubDVertex *)0x0;
  pOVar4 = pOVar3 + iVar2;
  pOVar4->m_extruded_edges_count = '\0';
  pOVar4->m_initial_vertex_tag = Unset;
  pOVar4->m_connecting_edge_tag = Unset;
  pOVar4->field_0x13 = 0;
  pOVar4->m_initial_vertex_id = 0;
  *(undefined8 *)(&pOVar4->m_extruded_edges_count + 8) = 0;
  pOVar3[iVar2].m_extruded_edges[0] = (ON_Internal_ExtrudedEdge *)0x0;
  pOVar3[iVar2].m_extruded_edges[1] = (ON_Internal_ExtrudedEdge *)0x0;
  pOVar3[iVar2].m_connecting_edge = (ON_SubDEdge *)0x0;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}